

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  char c;
  char *aBuf;
  PorterContext *p;
  int nBuf;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  char cVar2;
  int *pnBuf;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  if ((in_ECX < 0x41) && (2 < in_ECX)) {
    pnBuf = *(int **)(in_RDI + 0x10);
    local_c = in_ECX;
    memcpy(pnBuf,in_RDX,(long)in_ECX);
    fts5PorterStep1A((char *)pnBuf,&local_c);
    iVar1 = fts5PorterStep1B(in_RDI,pnBuf);
    if ((iVar1 != 0) && (iVar1 = fts5PorterStep1B2(in_RDI,pnBuf), iVar1 == 0)) {
      cVar2 = *(char *)((long)pnBuf + (long)(local_c + -1));
      in_stack_ffffffffffffffb4 = CONCAT13(cVar2,(int3)in_stack_ffffffffffffffb4);
      iVar1 = fts5PorterIsVowel(cVar2,0);
      if (((iVar1 == 0) &&
          (((cVar2 = (char)((uint)in_stack_ffffffffffffffb4 >> 0x18), cVar2 != 'l' && (cVar2 != 's')
            ) && (cVar2 != 'z')))) && (cVar2 == *(char *)((long)pnBuf + (long)(local_c + -2)))) {
        local_c = local_c + -1;
      }
      else {
        iVar1 = fts5Porter_MEq1(in_stack_ffffffffffffffa8,0);
        if ((iVar1 != 0) &&
           (iVar1 = fts5Porter_Ostar((char *)pnBuf,in_stack_ffffffffffffffb4), iVar1 != 0)) {
          *(undefined1 *)((long)pnBuf + (long)local_c) = 0x65;
          local_c = local_c + 1;
        }
      }
    }
    if ((*(char *)((long)pnBuf + (long)(local_c + -1)) == 'y') &&
       (iVar1 = fts5Porter_Vowel(in_stack_ffffffffffffffa8,0), iVar1 != 0)) {
      *(undefined1 *)((long)pnBuf + (long)(local_c + -1)) = 0x69;
    }
    fts5PorterStep2(in_RDI,pnBuf);
    fts5PorterStep3(in_RDI,pnBuf);
    fts5PorterStep4(in_RDI,pnBuf);
    if ((*(char *)((long)pnBuf + (long)(local_c + -1)) == 'e') &&
       ((iVar1 = fts5Porter_MGt1(in_stack_ffffffffffffffa8,0), iVar1 != 0 ||
        ((iVar1 = fts5Porter_MEq1(in_stack_ffffffffffffffa8,0), iVar1 != 0 &&
         (iVar1 = fts5Porter_Ostar((char *)pnBuf,in_stack_ffffffffffffffb4), iVar1 == 0)))))) {
      local_c = local_c + -1;
    }
    if ((((1 < local_c) && (*(char *)((long)pnBuf + (long)(local_c + -1)) == 'l')) &&
        (*(char *)((long)pnBuf + (long)(local_c + -2)) == 'l')) &&
       (iVar1 = fts5Porter_MGt1(in_stack_ffffffffffffffa8,0), iVar1 != 0)) {
      local_c = local_c + -1;
    }
    local_10 = (**(code **)(in_RDI + 8))(*(undefined8 *)in_RDI,in_ESI,pnBuf,local_c,in_R8D,in_R9D);
  }
  else {
    local_10 = (**(code **)(in_RDI + 8))(*(undefined8 *)in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int fts5PorterCb(
  void *pCtx,
  int tflags,
  const char *pToken,
  int nToken,
  int iStart,
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2]
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1)
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l'
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1)
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}